

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# factory.cpp
# Opt level: O1

void __thiscall r_exec::MkNew::MkNew(MkNew *this,Mem *m,Code *object)

{
  int iVar1;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  undefined4 extraout_var_01;
  Atom local_1c [4];
  Atom local_18 [4];
  Atom local_14 [4];
  
  r_code::Code::Code((Code *)this);
  (this->super_LObject).super_Object<r_code::LObject,_r_exec::LObject>.super_LObject._references.
  m_vector.super__Vector_base<core::P<r_code::Code>,_std::allocator<core::P<r_code::Code>_>_>.
  _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->super_LObject).super_Object<r_code::LObject,_r_exec::LObject>.super_LObject._references.
  m_vector.super__Vector_base<core::P<r_code::Code>,_std::allocator<core::P<r_code::Code>_>_>.
  _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->super_LObject).super_Object<r_code::LObject,_r_exec::LObject>.super_LObject._code.m_vector.
  super__Vector_base<r_code::Atom,_std::allocator<r_code::Atom>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  (this->super_LObject).super_Object<r_code::LObject,_r_exec::LObject>.super_LObject._references.
  m_vector.super__Vector_base<core::P<r_code::Code>,_std::allocator<core::P<r_code::Code>_>_>.
  _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->super_LObject).super_Object<r_code::LObject,_r_exec::LObject>.super_LObject._code.m_vector.
  super__Vector_base<r_code::Atom,_std::allocator<r_code::Atom>_>._M_impl.super__Vector_impl_data.
  _M_start = (pointer)0x0;
  (this->super_LObject).super_Object<r_code::LObject,_r_exec::LObject>.super_LObject._code.m_vector.
  super__Vector_base<r_code::Atom,_std::allocator<r_code::Atom>_>._M_impl.super__Vector_impl_data.
  _M_finish = (pointer)0x0;
  (this->super_LObject).super_Object<r_code::LObject,_r_exec::LObject>.hash_value = 0;
  (this->super_LObject).super_Object<r_code::LObject,_r_exec::LObject>.invalidated = 0;
  (this->super_LObject).super_Object<r_code::LObject,_r_exec::LObject>.m_pslnThrMutex.
  super___mutex_base._M_mutex.__align = 0;
  *(undefined8 *)
   ((long)&(this->super_LObject).super_Object<r_code::LObject,_r_exec::LObject>.m_pslnThrMutex.
           super___mutex_base._M_mutex + 8) = 0;
  *(undefined8 *)
   ((long)&(this->super_LObject).super_Object<r_code::LObject,_r_exec::LObject>.m_pslnThrMutex.
           super___mutex_base._M_mutex + 0x10) = 0;
  (this->super_LObject).super_Object<r_code::LObject,_r_exec::LObject>.m_pslnThrMutex.
  super___mutex_base._M_mutex.__data.__list.__prev = (__pthread_internal_list *)0x0;
  (this->super_LObject).super_Object<r_code::LObject,_r_exec::LObject>.m_pslnThrMutex.
  super___mutex_base._M_mutex.__data.__list.__next = (__pthread_internal_list *)0x0;
  (this->super_LObject).super_Object<r_code::LObject,_r_exec::LObject>.m_viewsMutex.
  super___mutex_base._M_mutex.__align = 0;
  *(undefined8 *)
   ((long)&(this->super_LObject).super_Object<r_code::LObject,_r_exec::LObject>.m_viewsMutex.
           super___mutex_base._M_mutex + 8) = 0;
  *(undefined8 *)
   ((long)&(this->super_LObject).super_Object<r_code::LObject,_r_exec::LObject>.m_viewsMutex.
           super___mutex_base._M_mutex + 0x10) = 0;
  (this->super_LObject).super_Object<r_code::LObject,_r_exec::LObject>.m_viewsMutex.
  super___mutex_base._M_mutex.__data.__list.__prev = (__pthread_internal_list *)0x0;
  (this->super_LObject).super_Object<r_code::LObject,_r_exec::LObject>.m_viewsMutex.
  super___mutex_base._M_mutex.__data.__list.__next = (__pthread_internal_list *)0x0;
  (this->super_LObject).super_Object<r_code::LObject,_r_exec::LObject>.m_markersMutex.
  super___mutex_base._M_mutex.__align = 0;
  *(undefined8 *)
   ((long)&(this->super_LObject).super_Object<r_code::LObject,_r_exec::LObject>.m_markersMutex.
           super___mutex_base._M_mutex + 8) = 0;
  *(undefined8 *)
   ((long)&(this->super_LObject).super_Object<r_code::LObject,_r_exec::LObject>.m_markersMutex.
           super___mutex_base._M_mutex + 0x10) = 0;
  (this->super_LObject).super_Object<r_code::LObject,_r_exec::LObject>.m_markersMutex.
  super___mutex_base._M_mutex.__data.__list.__prev = (__pthread_internal_list *)0x0;
  (this->super_LObject).super_Object<r_code::LObject,_r_exec::LObject>.m_markersMutex.
  super___mutex_base._M_mutex.__data.__list.__next = (__pthread_internal_list *)0x0;
  (this->super_LObject).super_Object<r_code::LObject,_r_exec::LObject>.super_LObject._oid =
       0xffffffff;
  (this->super_LObject).super_Object<r_code::LObject,_r_exec::LObject>.super_LObject.super_Code.
  super__Object._vptr__Object = (_func_int **)&PTR__Object_001be608;
  r_code::Atom::Marker((ushort)local_14,(uchar)Opcodes::MkNew);
  iVar1 = (*(this->super_LObject).super_Object<r_code::LObject,_r_exec::LObject>.super_LObject.
            super_Code.super__Object._vptr__Object[4])(this,0);
  r_code::Atom::operator=((Atom *)CONCAT44(extraout_var,iVar1),local_14);
  r_code::Atom::~Atom(local_14);
  r_code::Atom::RPointer((ushort)local_18);
  iVar1 = (*(this->super_LObject).super_Object<r_code::LObject,_r_exec::LObject>.super_LObject.
            super_Code.super__Object._vptr__Object[4])(this,1);
  r_code::Atom::operator=((Atom *)CONCAT44(extraout_var_00,iVar1),local_18);
  r_code::Atom::~Atom(local_18);
  r_code::Atom::Float(0.0);
  iVar1 = (*(this->super_LObject).super_Object<r_code::LObject,_r_exec::LObject>.super_LObject.
            super_Code.super__Object._vptr__Object[4])(this,2);
  r_code::Atom::operator=((Atom *)CONCAT44(extraout_var_01,iVar1),local_1c);
  r_code::Atom::~Atom(local_1c);
  (*(this->super_LObject).super_Object<r_code::LObject,_r_exec::LObject>.super_LObject.super_Code.
    super__Object._vptr__Object[8])(this,0,object);
  return;
}

Assistant:

MkNew::MkNew(r_code::Mem *m, Code *object): LObject(m)
{
    uint16_t write_index = 0;
    code(write_index++) = r_code::Atom::Marker(Opcodes::MkNew, 2);
    code(write_index++) = r_code::Atom::RPointer(0); // object.
    code(write_index++) = r_code::Atom::Float(0); // psln_thr.
    set_reference(0, object);
}